

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O3

int ASN1_primitive_new(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  ASN1_STRING *pAVar1;
  ASN1_OBJECT *pAVar2;
  int type;
  
  if (it == (ASN1_ITEM *)0x0) {
    return 0;
  }
  if (it->tcount != 0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_new.cc"
                  ,0xda,"int ASN1_primitive_new(ASN1_VALUE **, const ASN1_ITEM *)");
  }
  type = -1;
  if (it->itype != '\x05') {
    type = *(int *)&it->field_0x4;
    if (type < 5) {
      if (type == -4) {
        pAVar1 = (ASN1_STRING *)OPENSSL_malloc(0x10);
        if (pAVar1 == (ASN1_STRING *)0x0) {
          return 0;
        }
        pAVar1->data = (uchar *)0x0;
        pAVar1->length = -1;
        goto LAB_00207de4;
      }
      if (type == 1) {
        *(undefined4 *)pval = *(undefined4 *)&it->funcs;
        return 1;
      }
    }
    else {
      if (type == 5) {
        *pval = (ASN1_VALUE *)0x1;
        return 1;
      }
      if (type == 6) {
        pAVar2 = OBJ_get_undef();
        *pval = (ASN1_VALUE *)pAVar2;
        return 1;
      }
    }
  }
  pAVar1 = ASN1_STRING_type_new(type);
LAB_00207de4:
  *pval = (ASN1_VALUE *)pAVar1;
  return (uint)(pAVar1 != (ASN1_STRING *)0x0);
}

Assistant:

static int ASN1_primitive_new(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  if (!it) {
    return 0;
  }

  // Historically, |it->funcs| for primitive types contained an
  // |ASN1_PRIMITIVE_FUNCS| table of calbacks.
  assert(it->funcs == NULL);

  int utype;
  if (it->itype == ASN1_ITYPE_MSTRING) {
    utype = -1;
  } else {
    utype = it->utype;
  }
  switch (utype) {
    case V_ASN1_OBJECT:
      *pval = (ASN1_VALUE *)OBJ_get_undef();
      return 1;

    case V_ASN1_BOOLEAN:
      *(ASN1_BOOLEAN *)pval = (ASN1_BOOLEAN)it->size;
      return 1;

    case V_ASN1_NULL:
      *pval = (ASN1_VALUE *)1;
      return 1;

    case V_ASN1_ANY: {
      ASN1_TYPE *typ =
          reinterpret_cast<ASN1_TYPE *>(OPENSSL_malloc(sizeof(ASN1_TYPE)));
      if (!typ) {
        return 0;
      }
      typ->value.ptr = NULL;
      typ->type = -1;
      *pval = (ASN1_VALUE *)typ;
      break;
    }

    default:
      *pval = (ASN1_VALUE *)ASN1_STRING_type_new(utype);
      break;
  }
  if (*pval) {
    return 1;
  }
  return 0;
}